

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O3

void s_send<std::basic_string_view<char,std::char_traits<char>>>
               (socket_t *socket,basic_string_view<char,_std::char_traits<char>_> *value,
               string_view trace,int flags)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = s_try_send<std::basic_string_view<char,std::char_traits<char>>>(socket,value,flags);
  if (bVar1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,trace._M_str,trace._M_str + trace._M_len);
  std::operator+(&local_48,"s_send failed ",&local_68);
  std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void s_send(zmq::socket_t *socket, const T &value, std::string_view trace,
            int flags = 0) {
    if (!s_try_send<T>(socket, value, flags)) {
        throw std::runtime_error("s_send failed " + std::string(trace));
    }
}